

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O1

HCOSE_MAC COSE_Mac_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  COSE_MacMessage *p;
  
  if (flags == COSE_INIT_FLAGS_NONE) {
    p = (COSE_MacMessage *)calloc(1,0x60);
    if (p != (COSE_MacMessage *)0x0) {
      _Var1 = _COSE_Init(COSE_INIT_FLAGS_NONE,(COSE *)p,0x61,perr);
      if (_Var1) {
        _COSE_InsertInList(&MacRoot,(COSE *)p);
        return (HCOSE_MAC)p;
      }
      goto LAB_001fa7f5;
    }
    cVar2 = COSE_ERR_OUT_OF_MEMORY;
  }
  else {
    cVar2 = COSE_ERR_INVALID_PARAMETER;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar2;
  }
  p = (COSE_MacMessage *)0x0;
LAB_001fa7f5:
  if (p != (COSE_MacMessage *)0x0) {
    _COSE_Mac_Release(p);
    free(p);
  }
  return (HCOSE_MAC)0x0;
}

Assistant:

HCOSE_MAC COSE_Mac_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	COSE_MacMessage * pobj = NULL;

	CHECK_CONDITION(flags == COSE_INIT_FLAGS_NONE, COSE_ERR_INVALID_PARAMETER);

	pobj = (COSE_MacMessage *)COSE_CALLOC(1, sizeof(COSE_MacMessage), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags, &pobj->m_message, COSE_mac_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		goto errorReturn;
	}

	_COSE_InsertInList(&MacRoot, &pobj->m_message);

	return (HCOSE_MAC)pobj;

errorReturn:
	if (pobj != NULL) {
		_COSE_Mac_Release(pobj);
		COSE_FREE(pobj, context);
	}
	return NULL;
}